

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_32x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  __m128i weights;
  __m128i scale;
  __m128i top4;
  __m128i top3;
  __m128i top2;
  __m128i top1;
  __m128i top_hi;
  __m128i top_lo;
  __m128i bottom_left;
  __m128i zero;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_7dc;
  undefined8 *local_6f0;
  byte bStack_670;
  byte bStack_66f;
  byte bStack_66e;
  byte bStack_66d;
  byte bStack_66c;
  byte bStack_66b;
  byte bStack_66a;
  byte bStack_669;
  byte bStack_650;
  byte bStack_64f;
  byte bStack_64e;
  byte bStack_64d;
  byte bStack_64c;
  byte bStack_64b;
  byte bStack_64a;
  byte bStack_649;
  byte local_5d8;
  byte bStack_5d7;
  byte bStack_5d6;
  byte bStack_5d5;
  byte bStack_5d4;
  byte bStack_5d3;
  byte bStack_5d2;
  byte bStack_5d1;
  byte local_598;
  byte bStack_597;
  byte bStack_596;
  byte bStack_595;
  byte bStack_594;
  byte bStack_593;
  byte bStack_592;
  byte bStack_591;
  ushort uStack_566;
  ushort uStack_564;
  ushort uStack_562;
  ushort uStack_55e;
  ushort uStack_55c;
  ushort uStack_55a;
  ushort uStack_376;
  ushort uStack_374;
  ushort uStack_372;
  ushort uStack_36e;
  ushort uStack_36c;
  ushort uStack_36a;
  ushort uStack_356;
  ushort uStack_354;
  ushort uStack_352;
  ushort uStack_34e;
  ushort uStack_34c;
  ushort uStack_34a;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  ushort uStack_1b6;
  ushort uStack_1b4;
  ushort uStack_1b2;
  ushort uStack_1ae;
  ushort uStack_1ac;
  ushort uStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  ushort uStack_196;
  ushort uStack_194;
  ushort uStack_192;
  ushort uStack_18e;
  ushort uStack_18c;
  ushort uStack_18a;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  int y_mask;
  __m128i round;
  __m128i scaled_bottom_left;
  __m128i inverted_weights;
  
  bVar1 = *(byte *)(in_RCX + 7);
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  uVar4 = in_RDX[2];
  uVar5 = in_RDX[3];
  local_598 = (byte)uVar2;
  bStack_597 = (byte)((ulong)uVar2 >> 8);
  bStack_596 = (byte)((ulong)uVar2 >> 0x10);
  bStack_595 = (byte)((ulong)uVar2 >> 0x18);
  bStack_594 = (byte)((ulong)uVar2 >> 0x20);
  bStack_593 = (byte)((ulong)uVar2 >> 0x28);
  bStack_592 = (byte)((ulong)uVar2 >> 0x30);
  bStack_591 = (byte)((ulong)uVar2 >> 0x38);
  bStack_650 = (byte)uVar3;
  bStack_64f = (byte)((ulong)uVar3 >> 8);
  bStack_64e = (byte)((ulong)uVar3 >> 0x10);
  bStack_64d = (byte)((ulong)uVar3 >> 0x18);
  bStack_64c = (byte)((ulong)uVar3 >> 0x20);
  bStack_64b = (byte)((ulong)uVar3 >> 0x28);
  bStack_64a = (byte)((ulong)uVar3 >> 0x30);
  bStack_649 = (byte)((ulong)uVar3 >> 0x38);
  local_5d8 = (byte)uVar4;
  bStack_5d7 = (byte)((ulong)uVar4 >> 8);
  bStack_5d6 = (byte)((ulong)uVar4 >> 0x10);
  bStack_5d5 = (byte)((ulong)uVar4 >> 0x18);
  bStack_5d4 = (byte)((ulong)uVar4 >> 0x20);
  bStack_5d3 = (byte)((ulong)uVar4 >> 0x28);
  bStack_5d2 = (byte)((ulong)uVar4 >> 0x30);
  bStack_5d1 = (byte)((ulong)uVar4 >> 0x38);
  bStack_670 = (byte)uVar5;
  bStack_66f = (byte)((ulong)uVar5 >> 8);
  bStack_66e = (byte)((ulong)uVar5 >> 0x10);
  bStack_66d = (byte)((ulong)uVar5 >> 0x18);
  bStack_66c = (byte)((ulong)uVar5 >> 0x20);
  bStack_66b = (byte)((ulong)uVar5 >> 0x28);
  bStack_66a = (byte)((ulong)uVar5 >> 0x30);
  bStack_669 = (byte)((ulong)uVar5 >> 0x38);
  uStack_566 = (ushort)bVar1;
  uStack_564 = (ushort)bVar1;
  uStack_562 = (ushort)bVar1;
  uStack_55e = (ushort)bVar1;
  uStack_55c = (ushort)bVar1;
  uStack_55a = (ushort)bVar1;
  local_6f0 = in_RDI;
  for (local_7dc = 0x1000100; local_7dc < 0xf0e0f0f; local_7dc = local_7dc + 0x2020202) {
    auVar7._8_7_ = 0x20002500320049;
    auVar7._0_8_ = 0x69009200c500ff;
    auVar7[0xf] = 0;
    auVar12._8_8_ = CONCAT44(local_7dc,local_7dc);
    auVar12._0_8_ = CONCAT44(local_7dc,local_7dc);
    auVar12 = pshufb(auVar7,auVar12);
    auVar6._2_2_ = uStack_566 * 0x3b;
    auVar6._0_2_ = CONCAT11(0,bVar1);
    auVar6._4_2_ = uStack_564 * 0x6e;
    auVar6._6_2_ = uStack_562 * 0x97;
    auVar6._10_2_ = uStack_55e * 0xce;
    auVar6._8_2_ = CONCAT11(0,bVar1) * 0xb7;
    auVar6._12_2_ = uStack_55c * 0xdb;
    auVar6._14_2_ = uStack_55a * 0xe0;
    auVar13._8_8_ = CONCAT44(local_7dc,local_7dc);
    auVar13._0_8_ = CONCAT44(local_7dc,local_7dc);
    auVar13 = pshufb(auVar6,auVar13);
    uStack_196 = (ushort)bStack_597;
    uStack_194 = (ushort)bStack_596;
    uStack_192 = (ushort)bStack_595;
    uStack_18e = (ushort)bStack_593;
    uStack_18c = (ushort)bStack_592;
    uStack_18a = (ushort)bStack_591;
    local_1a8 = auVar12._0_2_;
    sStack_1a6 = auVar12._2_2_;
    sStack_1a4 = auVar12._4_2_;
    sStack_1a2 = auVar12._6_2_;
    sStack_1a0 = auVar12._8_2_;
    sStack_19e = auVar12._10_2_;
    sStack_19c = auVar12._12_2_;
    sStack_19a = auVar12._14_2_;
    uStack_1b6 = (ushort)bStack_64f;
    uStack_1b4 = (ushort)bStack_64e;
    uStack_1b2 = (ushort)bStack_64d;
    uStack_1ae = (ushort)bStack_64b;
    uStack_1ac = (ushort)bStack_64a;
    uStack_1aa = (ushort)bStack_649;
    local_1d8 = auVar13._0_2_;
    sStack_1d6 = auVar13._2_2_;
    sStack_1d4 = auVar13._4_2_;
    sStack_1d2 = auVar13._6_2_;
    sStack_1d0 = auVar13._8_2_;
    sStack_1ce = auVar13._10_2_;
    sStack_1cc = auVar13._12_2_;
    sStack_1ca = auVar13._14_2_;
    uVar8 = local_1d8 + (ushort)local_598 * local_1a8 + 0x80;
    uVar14 = sStack_1d6 + uStack_196 * sStack_1a6 + 0x80;
    uVar18 = sStack_1d4 + uStack_194 * sStack_1a4 + 0x80;
    uVar22 = sStack_1d2 + uStack_192 * sStack_1a2 + 0x80;
    uVar26 = sStack_1d0 + (ushort)bStack_594 * sStack_1a0 + 0x80;
    uVar30 = sStack_1ce + uStack_18e * sStack_19e + 0x80;
    uVar34 = sStack_1cc + uStack_18c * sStack_19c + 0x80;
    uVar38 = sStack_1ca + uStack_18a * sStack_19a + 0x80;
    uVar9 = uVar8 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar10 = local_1d8 + (ushort)bStack_650 * local_1a8 + 0x80;
    uVar16 = sStack_1d6 + uStack_1b6 * sStack_1a6 + 0x80;
    uVar20 = sStack_1d4 + uStack_1b4 * sStack_1a4 + 0x80;
    uVar24 = sStack_1d2 + uStack_1b2 * sStack_1a2 + 0x80;
    uVar28 = sStack_1d0 + (ushort)bStack_64c * sStack_1a0 + 0x80;
    uVar32 = sStack_1ce + uStack_1ae * sStack_19e + 0x80;
    uVar36 = sStack_1cc + uStack_1ac * sStack_19c + 0x80;
    uVar40 = sStack_1ca + uStack_1aa * sStack_19a + 0x80;
    uVar11 = uVar10 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    *local_6f0 = CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39),
                          CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                   (0xff < uVar35),
                                   CONCAT15((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) -
                                            (0xff < uVar31),
                                            CONCAT14((uVar27 != 0) * (uVar27 < 0x100) *
                                                     (char)(uVar26 >> 8) - (0xff < uVar27),
                                                     CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                              (char)(uVar22 >> 8) - (0xff < uVar23),
                                                              CONCAT12((uVar19 != 0) *
                                                                       (uVar19 < 0x100) *
                                                                       (char)(uVar18 >> 8) -
                                                                       (0xff < uVar19),
                                                                       CONCAT11((uVar15 != 0) *
                                                                                (uVar15 < 0x100) *
                                                                                (char)(uVar14 >> 8)
                                                                                - (0xff < uVar15),
                                                                                (uVar9 != 0) *
                                                                                (uVar9 < 0x100) *
                                                                                (char)(uVar8 >> 8) -
                                                                                (0xff < uVar9)))))))
                         );
    local_6f0[1] = CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41)
                            ,CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                                      (0xff < uVar37),
                                      CONCAT15((uVar33 != 0) * (uVar33 < 0x100) *
                                               (char)(uVar32 >> 8) - (0xff < uVar33),
                                               CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                        (char)(uVar28 >> 8) - (0xff < uVar29),
                                                        CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                                 (char)(uVar24 >> 8) -
                                                                 (0xff < uVar25),
                                                                 CONCAT12((uVar21 != 0) *
                                                                          (uVar21 < 0x100) *
                                                                          (char)(uVar20 >> 8) -
                                                                          (0xff < uVar21),
                                                                          CONCAT11((uVar17 != 0) *
                                                                                   (uVar17 < 0x100)
                                                                                   * (char)(uVar16 
                                                  >> 8) - (0xff < uVar17),
                                                  (uVar11 != 0) * (uVar11 < 0x100) *
                                                  (char)(uVar10 >> 8) - (0xff < uVar11))))))));
    uStack_356 = (ushort)bStack_5d7;
    uStack_354 = (ushort)bStack_5d6;
    uStack_352 = (ushort)bStack_5d5;
    uStack_34e = (ushort)bStack_5d3;
    uStack_34c = (ushort)bStack_5d2;
    uStack_34a = (ushort)bStack_5d1;
    uStack_376 = (ushort)bStack_66f;
    uStack_374 = (ushort)bStack_66e;
    uStack_372 = (ushort)bStack_66d;
    uStack_36e = (ushort)bStack_66b;
    uStack_36c = (ushort)bStack_66a;
    uStack_36a = (ushort)bStack_669;
    uVar8 = local_1d8 + (ushort)local_5d8 * local_1a8 + 0x80;
    uVar14 = sStack_1d6 + uStack_356 * sStack_1a6 + 0x80;
    uVar18 = sStack_1d4 + uStack_354 * sStack_1a4 + 0x80;
    uVar22 = sStack_1d2 + uStack_352 * sStack_1a2 + 0x80;
    uVar26 = sStack_1d0 + (ushort)bStack_5d4 * sStack_1a0 + 0x80;
    uVar30 = sStack_1ce + uStack_34e * sStack_19e + 0x80;
    uVar34 = sStack_1cc + uStack_34c * sStack_19c + 0x80;
    uVar38 = sStack_1ca + uStack_34a * sStack_19a + 0x80;
    uVar9 = uVar8 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    uVar10 = local_1d8 + (ushort)bStack_670 * local_1a8 + 0x80;
    uVar16 = sStack_1d6 + uStack_376 * sStack_1a6 + 0x80;
    uVar20 = sStack_1d4 + uStack_374 * sStack_1a4 + 0x80;
    uVar24 = sStack_1d2 + uStack_372 * sStack_1a2 + 0x80;
    uVar28 = sStack_1d0 + (ushort)bStack_66c * sStack_1a0 + 0x80;
    uVar32 = sStack_1ce + uStack_36e * sStack_19e + 0x80;
    uVar36 = sStack_1cc + uStack_36c * sStack_19c + 0x80;
    uVar40 = sStack_1ca + uStack_36a * sStack_19a + 0x80;
    uVar11 = uVar10 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar41 = uVar40 >> 8;
    local_6f0[2] = CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39)
                            ,CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                      (0xff < uVar35),
                                      CONCAT15((uVar31 != 0) * (uVar31 < 0x100) *
                                               (char)(uVar30 >> 8) - (0xff < uVar31),
                                               CONCAT14((uVar27 != 0) * (uVar27 < 0x100) *
                                                        (char)(uVar26 >> 8) - (0xff < uVar27),
                                                        CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                                 (char)(uVar22 >> 8) -
                                                                 (0xff < uVar23),
                                                                 CONCAT12((uVar19 != 0) *
                                                                          (uVar19 < 0x100) *
                                                                          (char)(uVar18 >> 8) -
                                                                          (0xff < uVar19),
                                                                          CONCAT11((uVar15 != 0) *
                                                                                   (uVar15 < 0x100)
                                                                                   * (char)(uVar14 
                                                  >> 8) - (0xff < uVar15),
                                                  (uVar9 != 0) * (uVar9 < 0x100) *
                                                  (char)(uVar8 >> 8) - (0xff < uVar9))))))));
    local_6f0[3] = CONCAT17((uVar41 != 0) * (uVar41 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar41)
                            ,CONCAT16((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) -
                                      (0xff < uVar37),
                                      CONCAT15((uVar33 != 0) * (uVar33 < 0x100) *
                                               (char)(uVar32 >> 8) - (0xff < uVar33),
                                               CONCAT14((uVar29 != 0) * (uVar29 < 0x100) *
                                                        (char)(uVar28 >> 8) - (0xff < uVar29),
                                                        CONCAT13((uVar25 != 0) * (uVar25 < 0x100) *
                                                                 (char)(uVar24 >> 8) -
                                                                 (0xff < uVar25),
                                                                 CONCAT12((uVar21 != 0) *
                                                                          (uVar21 < 0x100) *
                                                                          (char)(uVar20 >> 8) -
                                                                          (0xff < uVar21),
                                                                          CONCAT11((uVar17 != 0) *
                                                                                   (uVar17 < 0x100)
                                                                                   * (char)(uVar16 
                                                  >> 8) - (0xff < uVar17),
                                                  (uVar11 != 0) * (uVar11 < 0x100) *
                                                  (char)(uVar10 >> 8) - (0xff < uVar11))))))));
    local_6f0 = (undefined8 *)(in_RSI + (long)local_6f0);
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_32x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bottom_left = _mm_set1_epi16(left_column[7]);
  const __m128i top_lo = LoadUnaligned16(top_row);
  const __m128i top_hi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lo, zero);
  const __m128i top3 = cvtepu8_epi16(top_hi);
  const __m128i top4 = _mm_unpackhi_epi8(top_hi, zero);
  __m128i scale = _mm_set1_epi16(256);
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}